

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpGCTest_Collect_Func_Test::TestBody(InterpGCTest_Collect_Func_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98;
  Message local_90;
  Index local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68;
  unsigned_long local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  Index after_new;
  Ptr func;
  InterpGCTest_Collect_Func_Test *this_local;
  
  InterpTest::ReadModule
            ((InterpTest *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (anonymous_namespace)::s_fac_module);
  memset(&func.root_index_,0,0x18);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&func.root_index_);
  InterpTest::Instantiate((InterpTest *)this,(RefVec *)&func.root_index_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector
            ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&func.root_index_);
  InterpTest::GetFuncExport((Ptr *)&after_new,(InterpTest *)this,0);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_60 = (this->super_InterpGCTest).before_new + 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_58,"before_new + 3","after_new",&local_60,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x274,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  wabt::interp::RefPtr<wabt::interp::Module>::reset
            (&(this->super_InterpGCTest).super_InterpTest.mod_);
  wabt::interp::RefPtr<wabt::interp::Instance>::reset
            (&(this->super_InterpGCTest).super_InterpTest.inst_);
  wabt::interp::Store::Collect(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_88 = wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_80,"after_new","store_.object_count()",
             (unsigned_long *)&gtest_ar.message_,&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x27a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr
            ((RefPtr<wabt::interp::DefinedFunc> *)&after_new);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_Func) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);  // module, instance, func.

  // Reset module and instance roots, but they'll be kept alive by the func.
  mod_.reset();
  inst_.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());
}